

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O2

Host * __thiscall Vault::Client::getHost_abi_cxx11_(Host *__return_storage_ptr__,Client *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->host_);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] virtual Host getHost() const { return host_; }